

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QSsl::ImplementedClass,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QDebug in_stack_ffffffffffffffe8;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::QDebug((QDebug *)&stack0xffffffffffffffe8,in_RSI);
  ::operator<<((QDebug *)in_stack_ffffffffffffffe8.stream,(ImplementedClass)((ulong)in_RDI >> 0x20))
  ;
  QDebug::~QDebug(&local_10);
  QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }